

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O0

int xmlExpandCatalog(xmlCatalogPtr catal,char *filename)

{
  int iVar1;
  xmlChar *value;
  xmlCatalogEntryPtr pxVar2;
  xmlCatalogEntryPtr local_40;
  xmlCatalogEntryPtr cur;
  xmlCatalogEntryPtr tmp;
  xmlChar *content;
  int ret;
  char *filename_local;
  xmlCatalogPtr catal_local;
  
  if ((catal == (xmlCatalogPtr)0x0) || (filename == (char *)0x0)) {
    return -1;
  }
  if (catal->type == XML_SGML_CATALOG_TYPE) {
    value = xmlLoadFileContent(filename);
    if (value == (xmlChar *)0x0) {
      return -1;
    }
    iVar1 = xmlParseSGMLCatalog(catal,value,filename,0);
    if (iVar1 < 0) {
      (*xmlFree)(value);
      return -1;
    }
    (*xmlFree)(value);
  }
  else {
    pxVar2 = xmlNewCatalogEntry(XML_CATA_CATALOG,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)filename,
                                xmlCatalogDefaultPrefer,(xmlCatalogEntryPtr)0x0);
    local_40 = catal->xml;
    if (local_40 == (xmlCatalogEntryPtr)0x0) {
      catal->xml = pxVar2;
    }
    else {
      for (; local_40->next != (_xmlCatalogEntry *)0x0; local_40 = local_40->next) {
      }
      local_40->next = pxVar2;
    }
  }
  return 0;
}

Assistant:

static int
xmlExpandCatalog(xmlCatalogPtr catal, const char *filename)
{
    int ret;

    if ((catal == NULL) || (filename == NULL))
	return(-1);


    if (catal->type == XML_SGML_CATALOG_TYPE) {
	xmlChar *content;

	content = xmlLoadFileContent(filename);
	if (content == NULL)
	    return(-1);

        ret = xmlParseSGMLCatalog(catal, content, filename, 0);
	if (ret < 0) {
	    xmlFree(content);
	    return(-1);
	}
	xmlFree(content);
    } else {
	xmlCatalogEntryPtr tmp, cur;
	tmp = xmlNewCatalogEntry(XML_CATA_CATALOG, NULL,
		       NULL, BAD_CAST filename, xmlCatalogDefaultPrefer, NULL);

	cur = catal->xml;
	if (cur == NULL) {
	    catal->xml = tmp;
	} else {
	    while (cur->next != NULL) cur = cur->next;
	    cur->next = tmp;
	}
    }
    return (0);
}